

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratBig.cpp
# Opt level: O2

void __thiscall
primesieve::EratBig::crossOff(EratBig *this,uint8_t *sieve,SievingPrime *prime,SievingPrime *end)

{
  SievingPrime **sievingPrime;
  uint uVar1;
  int iVar2;
  SievingPrime **ppSVar3;
  MemoryPool *this_00;
  uint64_t uVar4;
  uint64_t uVar5;
  uintptr_t address;
  ulong uVar6;
  SievingPrime *pSVar7;
  ulong uVar8;
  
  ppSVar3 = (this->buckets_).array_;
  this_00 = this->memoryPool_;
  uVar4 = this->log2SieveSize_;
  uVar5 = this->moduloSieveSize_;
  for (; prime != end; prime = prime + 1) {
    uVar1 = prime->sievingPrime_;
    uVar8 = (ulong)(prime->indexes_ & 0x7fffff);
    uVar6 = (ulong)(prime->indexes_ >> 0x17);
    sieve[uVar8] = sieve[uVar8] & (anonymous_namespace)::wheel210[uVar6 * 8];
    uVar8 = (byte)(anonymous_namespace)::wheel210[uVar6 * 8 + 2] + uVar8 +
            (ulong)(byte)(anonymous_namespace)::wheel210[uVar6 * 8 + 1] * (ulong)uVar1;
    iVar2 = *(int *)((anonymous_namespace)::wheel210 + uVar6 * 8 + 4);
    sievingPrime = ppSVar3 + (uVar8 >> ((byte)uVar4 & 0x3f));
    pSVar7 = *sievingPrime;
    if (((ulong)pSVar7 & 0x1fff) == 0) {
      MemoryPool::addBucket(this_00,sievingPrime);
      pSVar7 = *sievingPrime;
    }
    *sievingPrime = pSVar7 + 1;
    pSVar7->indexes_ = (uint)uVar8 & (uint)uVar5 | iVar2 << 0x17;
    pSVar7->sievingPrime_ = uVar1;
  }
  return;
}

Assistant:

void EratBig::crossOff(uint8_t* sieve,
                       SievingPrime* prime,
                       SievingPrime* end)
{
  auto buckets = buckets_.data();
  MemoryPool& memoryPool = *memoryPool_;
  std::size_t moduloSieveSize = moduloSieveSize_;
  std::size_t log2SieveSize = log2SieveSize_;

  for (; prime != end; prime++)
  {
    std::size_t multipleIndex = prime->getMultipleIndex();
    std::size_t wheelIndex    = prime->getWheelIndex();
    std::size_t sievingPrime  = prime->getSievingPrime();

    // Cross-off the current multiple (unset bit)
    // and calculate the next multiple.
    sieve[multipleIndex] &= wheel210[wheelIndex].unsetBit;
    multipleIndex += wheel210[wheelIndex].nextMultipleFactor * sievingPrime;
    multipleIndex += wheel210[wheelIndex].correct;
    wheelIndex = wheel210[wheelIndex].next;
    std::size_t segment = multipleIndex >> log2SieveSize;
    multipleIndex &= moduloSieveSize;

    if (Bucket::isFull(buckets[segment]))
      memoryPool.addBucket(buckets[segment]);

    buckets[segment]++->set(sievingPrime, multipleIndex, wheelIndex);
  }
}